

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::deinit(TextureCubeMapArrayStencilAttachments *this)

{
  CubeMapArrayDataStorage *pCVar1;
  void *pvVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  long lVar4;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar4 + 0x4e8))(0xb90);
  cleanAfterTest(this);
  (**(code **)(lVar4 + 0xd8))(0);
  if (this->m_vbo_id != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_vbo_id);
    this->m_vbo_id = 0;
  }
  if (this->m_fbo_draw_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&this->m_fbo_draw_id);
    this->m_fbo_draw_id = 0;
  }
  if (this->m_fbo_read_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&this->m_fbo_read_id);
    this->m_fbo_read_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  pCVar1 = this->m_cube_map_array_data;
  if (pCVar1 != (CubeMapArrayDataStorage *)0x0) {
    lVar4 = *(long *)&pCVar1[-1].m_width;
    if (lVar4 != 0) {
      lVar5 = lVar4 * 0x18;
      do {
        pvVar2 = *(void **)((long)&pCVar1[-1].m_data_array + lVar5);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
          *(undefined8 *)((long)&pCVar1[-1].m_data_array + lVar5) = 0;
        }
        *(undefined4 *)((long)pCVar1 + lVar5 + -8) = 0;
        *(undefined8 *)((long)pCVar1 + lVar5 + -0x10) = 0;
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0);
    }
    operator_delete__(&pCVar1[-1].m_width,lVar4 * 0x18 + 8);
    this->m_cube_map_array_data = (CubeMapArrayDataStorage *)0x0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Disable the stencil test */
	gl.disable(GL_STENCIL_TEST);

	/* If any of the iterations have broken, we should clean up here. */
	cleanAfterTest();

	gl.bindVertexArray(0);

	/* Release test-wide objects */
	if (m_vbo_id != 0)
	{
		gl.deleteBuffers(1, &m_vbo_id);

		m_vbo_id = 0;
	}

	if (m_fbo_draw_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_draw_id);

		m_fbo_draw_id = 0;
	}

	if (m_fbo_read_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_read_id);

		m_fbo_read_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_cube_map_array_data != DE_NULL)
	{
		delete[] m_cube_map_array_data;

		m_cube_map_array_data = DE_NULL;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}